

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O2

void __thiscall OpenMD::SelectionEvaluator::invalidIndex(SelectionEvaluator *this,int index)

{
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  local_54 = index;
  toString<int>(&local_30,&local_54);
  std::operator+(&local_50,"invalid index : ",&local_30);
  evalError(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void invalidIndex(int index) {
      evalError("invalid index : " + toString(index));
    }